

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O2

void get_msurf_descriptor_rounding(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int i;
  int iVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  int k_count_1;
  long lVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  float *pfVar25;
  float *pfVar26;
  uint uVar27;
  float *pfVar28;
  ulong uVar29;
  ulong uVar30;
  int l_count;
  long lVar31;
  int k_count;
  long lVar32;
  float *pfVar33;
  float *pfVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  undefined1 in_ZMM8 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [64];
  
  auVar43._8_4_ = 0x3effffff;
  auVar43._0_8_ = 0x3effffff3effffff;
  auVar43._12_4_ = 0x3effffff;
  auVar42._8_4_ = 0x80000000;
  auVar42._0_8_ = 0x8000000080000000;
  auVar42._12_4_ = 0x80000000;
  fVar50 = ipoint->scale;
  auVar62 = ZEXT464((uint)fVar50);
  auVar44 = ZEXT416((uint)fVar50);
  auVar35 = vpternlogd_avx512vl(auVar43,auVar44,auVar42,0xf8);
  auVar35 = ZEXT416((uint)(fVar50 + auVar35._0_4_));
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  fVar47 = -0.08 / (fVar50 * fVar50);
  iVar22 = (int)auVar35._0_4_;
  auVar36._0_4_ = (int)auVar35._0_4_;
  auVar36._4_4_ = (int)auVar35._4_4_;
  auVar36._8_4_ = (int)auVar35._8_4_;
  auVar36._12_4_ = (int)auVar35._12_4_;
  auVar35 = vcvtdq2ps_avx(auVar36);
  auVar36 = vpternlogd_avx512vl(auVar43,ZEXT416((uint)ipoint->x),auVar42,0xf8);
  auVar36 = ZEXT416((uint)(ipoint->x + auVar36._0_4_));
  auVar36 = vroundss_avx(auVar36,auVar36,0xb);
  auVar37._0_8_ = (double)auVar36._0_4_;
  auVar37._8_8_ = auVar36._8_8_;
  auVar41._0_8_ = (double)fVar50;
  auVar41._8_8_ = 0;
  auVar36 = vfmadd231sd_fma(auVar37,auVar41,ZEXT816(0x3fe0000000000000));
  auVar40._0_4_ = (float)auVar36._0_8_;
  auVar40._4_12_ = auVar36._4_12_;
  auVar36 = vpternlogd_avx512vl(auVar43,ZEXT416((uint)ipoint->y),auVar42,0xf8);
  fVar3 = auVar40._0_4_ - auVar35._0_4_;
  auVar36 = ZEXT416((uint)(ipoint->y + auVar36._0_4_));
  auVar36 = vroundss_avx(auVar36,auVar36,0xb);
  auVar38._0_8_ = (double)auVar36._0_4_;
  auVar38._8_8_ = auVar36._8_8_;
  auVar36 = vfmadd231sd_fma(auVar38,auVar41,ZEXT816(0x3fe0000000000000));
  auVar39._0_4_ = (float)auVar36._0_8_;
  auVar39._4_12_ = auVar36._4_12_;
  fVar61 = auVar39._0_4_ - auVar35._0_4_;
  auVar37 = ZEXT416((uint)fVar50);
  auVar35 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar37,auVar40);
  auVar36 = vpternlogd_avx512vl(auVar43,auVar35,auVar42,0xf8);
  auVar35 = ZEXT416((uint)(auVar35._0_4_ + auVar36._0_4_));
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  if (iVar22 < (int)auVar35._0_4_) {
    auVar45._8_4_ = 0x3effffff;
    auVar45._0_8_ = 0x3effffff3effffff;
    auVar45._12_4_ = 0x3effffff;
    auVar46._8_4_ = 0x80000000;
    auVar46._0_8_ = 0x8000000080000000;
    auVar46._12_4_ = 0x80000000;
    auVar35 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar37,auVar39);
    auVar36 = vpternlogd_avx512vl(auVar46,auVar35,auVar45,0xea);
    auVar35 = ZEXT416((uint)(auVar35._0_4_ + auVar36._0_4_));
    auVar35 = vroundss_avx(auVar35,auVar35,0xb);
    if (iVar22 < (int)auVar35._0_4_) {
      auVar35 = vfmadd231ss_fma(auVar40,auVar37,ZEXT416(0x41300000));
      auVar56._8_4_ = 0x80000000;
      auVar56._0_8_ = 0x8000000080000000;
      auVar56._12_4_ = 0x80000000;
      auVar36 = vpternlogd_avx512vl(auVar56,auVar35,auVar45,0xea);
      auVar35 = ZEXT416((uint)(auVar35._0_4_ + auVar36._0_4_));
      auVar35 = vroundss_avx(auVar35,auVar35,0xb);
      if ((int)auVar35._0_4_ + iVar22 <= iimage->width) {
        auVar35 = vfmadd231ss_fma(auVar39,auVar37,ZEXT416(0x41300000));
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar36 = vpternlogd_avx512vl(auVar45,auVar35,auVar13,0xf8);
        auVar35 = ZEXT416((uint)(auVar35._0_4_ + auVar36._0_4_));
        auVar35 = vroundss_avx(auVar35,auVar35,0xb);
        if ((int)auVar35._0_4_ + iVar22 <= iimage->height) {
          iVar15 = -0xc;
          lVar21 = 0;
          for (lVar31 = 0; lVar31 != 0x18; lVar31 = lVar31 + 1) {
            auVar35._0_4_ = (float)iVar15;
            auVar35._4_12_ = in_ZMM8._4_12_;
            auVar35 = vfmadd213ss_fma(auVar35,auVar62._0_16_,ZEXT416((uint)(fVar61 + 0.5)));
            lVar20 = lVar21;
            for (lVar32 = 0; lVar32 != 0x18; lVar32 = lVar32 + 1) {
              auVar53._0_4_ = (float)((int)lVar32 + -0xc);
              auVar53._4_12_ = in_ZMM8._4_12_;
              auVar36 = vfmadd132ss_fma(auVar53,ZEXT416((uint)(fVar3 + 0.5)),ZEXT416((uint)fVar50));
              haarXY_unconditional
                        (iimage,(int)auVar35._0_4_,(int)auVar36._0_4_,iVar22,
                         (float *)((long)haarResponseX + lVar20),
                         (float *)((long)haarResponseY + lVar20));
              lVar20 = lVar20 + 4;
            }
            auVar62 = ZEXT1664(auVar44);
            iVar15 = iVar15 + 1;
            lVar21 = lVar21 + 0x60;
          }
          goto LAB_00150eff;
        }
      }
    }
  }
  iVar15 = -0xc;
  lVar21 = 0;
  for (lVar31 = 0; lVar31 != 0x18; lVar31 = lVar31 + 1) {
    auVar51._0_4_ = (float)iVar15;
    auVar51._4_12_ = in_ZMM8._4_12_;
    auVar35 = vfmadd213ss_fma(auVar51,auVar62._0_16_,ZEXT416((uint)fVar61));
    fVar48 = auVar35._0_4_;
    lVar20 = lVar21;
    for (lVar32 = 0; lVar32 != 0x18; lVar32 = lVar32 + 1) {
      auVar52._0_4_ = (float)((int)lVar32 + -0xc);
      auVar52._4_12_ = in_ZMM8._4_12_;
      auVar35 = vfmadd132ss_fma(auVar52,ZEXT416((uint)fVar3),ZEXT416((uint)fVar50));
      fVar49 = auVar35._0_4_;
      haarXY_precheck_boundaries
                (iimage,(int)((double)((ulong)(0.0 <= fVar48) * 0x3fe0000000000000 +
                                      (ulong)(0.0 > fVar48) * -0x4020000000000000) + (double)fVar48)
                 ,(int)((double)((ulong)(0.0 <= fVar49) * 0x3fe0000000000000 +
                                (ulong)(0.0 > fVar49) * -0x4020000000000000) + (double)fVar49),
                 iVar22,(float *)((long)haarResponseX + lVar20),
                 (float *)((long)haarResponseY + lVar20));
      lVar20 = lVar20 + 4;
    }
    auVar62 = ZEXT1664(auVar44);
    iVar15 = iVar15 + 1;
    lVar21 = lVar21 + 0x60;
  }
LAB_00150eff:
  fVar61 = auVar62._0_4_;
  auVar60._8_4_ = 0x3effffff;
  auVar60._0_8_ = 0x3effffff3effffff;
  auVar60._12_4_ = 0x3effffff;
  auVar59._8_4_ = 0x80000000;
  auVar59._0_8_ = 0x8000000080000000;
  auVar59._12_4_ = 0x80000000;
  auVar35 = vpternlogd_avx512vl(auVar60,ZEXT416((uint)(fVar61 * 0.5)),auVar59,0xf8);
  auVar35 = ZEXT416((uint)(fVar61 * 0.5 + auVar35._0_4_));
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  auVar36 = vpternlogd_avx512vl(auVar60,ZEXT416((uint)(fVar61 * 1.5)),auVar59,0xf8);
  auVar36 = ZEXT416((uint)(fVar61 * 1.5 + auVar36._0_4_));
  auVar36 = vroundss_avx(auVar36,auVar36,0xb);
  auVar37 = vpternlogd_avx512vl(auVar60,ZEXT416((uint)(fVar61 * 2.5)),auVar59,0xf8);
  auVar37 = ZEXT416((uint)(fVar61 * 2.5 + auVar37._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  auVar38 = vpternlogd_avx512vl(auVar60,ZEXT416((uint)(fVar61 * 3.5)),auVar59,0xf8);
  auVar38 = ZEXT416((uint)(fVar61 * 3.5 + auVar38._0_4_));
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  auVar39 = vpternlogd_avx512vl(auVar60,ZEXT416((uint)(fVar61 * 4.5)),auVar59,0xf8);
  auVar39 = ZEXT416((uint)(fVar61 * 4.5 + auVar39._0_4_));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar40 = vpternlogd_avx512vl(auVar60,ZEXT416((uint)(fVar61 * 5.5)),auVar59,0xf8);
  auVar40 = ZEXT416((uint)(fVar61 * 5.5 + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar41 = vpternlogd_avx512vl(auVar60,ZEXT416((uint)(fVar61 * 6.5)),auVar59,0xf8);
  auVar41 = ZEXT416((uint)(fVar61 * 6.5 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vpternlogd_avx512vl(auVar60,ZEXT416((uint)(fVar61 * 7.5)),auVar59,0xf8);
  auVar42 = ZEXT416((uint)(auVar42._0_4_ + fVar61 * 7.5));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vpternlogd_avx512vl(auVar60,ZEXT416((uint)(fVar61 * 8.5)),auVar59,0xf8);
  auVar43 = ZEXT416((uint)(fVar61 * 8.5 + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = vpternlogd_avx512vl(auVar60,ZEXT416((uint)(fVar61 * 9.5)),auVar59,0xf8);
  auVar44 = ZEXT416((uint)(fVar61 * 9.5 + auVar44._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = vpternlogd_avx512vl(auVar60,ZEXT416((uint)(fVar61 * 10.5)),auVar59,0xf8);
  auVar45 = ZEXT416((uint)(fVar61 * 10.5 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar60,ZEXT416((uint)(fVar61 * 11.5)),auVar59,0xf8);
  fVar54 = auVar37._0_4_;
  fVar50 = fVar54 + auVar36._0_4_;
  fVar3 = fVar54 + auVar35._0_4_;
  auVar37 = ZEXT416((uint)(fVar61 * 11.5 + auVar46._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  fVar61 = fVar54 - auVar35._0_4_;
  fVar48 = fVar54 - auVar36._0_4_;
  fVar49 = fVar54 - auVar38._0_4_;
  fVar4 = fVar54 - auVar39._0_4_;
  fVar5 = fVar54 - auVar40._0_4_;
  fVar54 = fVar54 - auVar41._0_4_;
  fVar58 = auVar42._0_4_;
  fVar6 = fVar58 - auVar38._0_4_;
  fVar7 = fVar58 - auVar39._0_4_;
  fVar8 = fVar58 - auVar40._0_4_;
  fVar9 = fVar58 - auVar41._0_4_;
  fVar10 = fVar58 - auVar43._0_4_;
  fVar11 = fVar58 - auVar44._0_4_;
  fVar12 = fVar58 - auVar45._0_4_;
  fVar58 = fVar58 - auVar37._0_4_;
  gauss_s1_c0[0] = expf(fVar50 * fVar50 * fVar47);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar47);
  gauss_s1_c0[2] = expf(fVar61 * fVar61 * fVar47);
  gauss_s1_c0[3] = expf(fVar48 * fVar48 * fVar47);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar49 * fVar49 * fVar47);
  gauss_s1_c0[6] = expf(fVar4 * fVar4 * fVar47);
  gauss_s1_c0[7] = expf(fVar5 * fVar5 * fVar47);
  gauss_s1_c0[8] = expf(fVar54 * fVar54 * fVar47);
  gauss_s1_c1[0] = expf(fVar6 * fVar6 * fVar47);
  gauss_s1_c1[1] = expf(fVar7 * fVar7 * fVar47);
  gauss_s1_c1[2] = expf(fVar8 * fVar8 * fVar47);
  gauss_s1_c1[3] = expf(fVar9 * fVar9 * fVar47);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar10 * fVar10 * fVar47);
  gauss_s1_c1[6] = expf(fVar11 * fVar11 * fVar47);
  gauss_s1_c1[7] = expf(fVar12 * fVar12 * fVar47);
  gauss_s1_c1[8] = expf(fVar58 * fVar58 * fVar47);
  auVar62 = ZEXT1264(ZEXT812(0));
  iVar22 = 0;
  auVar44._8_4_ = 0x7fffffff;
  auVar44._0_8_ = 0x7fffffff7fffffff;
  auVar44._12_4_ = 0x7fffffff;
  lVar21 = 0;
  uVar29 = 0xfffffffffffffff8;
  pfVar17 = haarResponseY;
  pfVar25 = haarResponseX;
  while (uVar27 = (uint)uVar29, (int)uVar27 < 8) {
    pfVar33 = gauss_s1_c0;
    lVar31 = (long)iVar22;
    lVar21 = (long)(int)lVar21;
    if (uVar27 == 7) {
      pfVar33 = gauss_s1_c1;
    }
    if (uVar27 == 0xfffffff8) {
      pfVar33 = gauss_s1_c1;
    }
    uVar23 = 0;
    iVar22 = iVar22 + 4;
    uVar30 = 0xfffffffffffffff8;
    pfVar18 = pfVar17;
    pfVar26 = pfVar25;
    while (lVar31 != iVar22) {
      iVar15 = (int)uVar30;
      pfVar28 = gauss_s1_c0;
      auVar55 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar30 = (ulong)((uint)(uVar30 >> 0x1c) & 8);
      if (iVar15 == 7) {
        pfVar28 = gauss_s1_c1;
      }
      if (iVar15 == -8) {
        pfVar28 = gauss_s1_c1;
      }
      pfVar16 = pfVar26;
      pfVar19 = pfVar18;
      for (uVar24 = uVar23; uVar24 < iVar15 * 0x18 + 0x198; uVar24 = uVar24 + 0x18) {
        lVar20 = 0;
        pfVar34 = (float *)((long)pfVar33 + (ulong)(((uint)(uVar29 >> 0x1f) & 1) << 5));
        while (lVar20 != 9) {
          fVar50 = *pfVar34;
          pfVar34 = pfVar34 + (ulong)(~uVar27 >> 0x1f) * 2 + -1;
          pfVar1 = pfVar19 + lVar20;
          pfVar2 = pfVar16 + lVar20;
          lVar20 = lVar20 + 1;
          auVar37 = ZEXT416((uint)(pfVar28[uVar30] * fVar50 * *pfVar2));
          auVar35 = vandps_avx(auVar37,auVar44);
          auVar38 = ZEXT416((uint)(pfVar28[uVar30] * fVar50 * *pfVar1));
          auVar36 = vandps_avx(auVar38,auVar44);
          auVar37 = vinsertps_avx(auVar38,auVar37,0x10);
          auVar36 = vmovlhps_avx(auVar37,auVar36);
          auVar35 = vinsertps_avx(auVar36,auVar35,0x30);
          auVar55 = ZEXT1664(CONCAT412(auVar55._12_4_ + auVar35._12_4_,
                                       CONCAT48(auVar55._8_4_ + auVar35._8_4_,
                                                CONCAT44(auVar55._4_4_ + auVar35._4_4_,
                                                         auVar55._0_4_ + auVar35._0_4_))));
        }
        uVar30 = uVar30 + (ulong)(-1 < iVar15) * 2 + -1;
        pfVar16 = pfVar16 + 0x18;
        pfVar19 = pfVar19 + 0x18;
      }
      uVar30 = (ulong)(iVar15 + 5);
      uVar23 = uVar23 + 0x78;
      fVar50 = gauss_s2_arr[lVar31];
      auVar14._4_4_ = fVar50;
      auVar14._0_4_ = fVar50;
      auVar14._8_4_ = fVar50;
      auVar14._12_4_ = fVar50;
      auVar38 = vmulps_avx512vl(auVar55._0_16_,auVar14);
      lVar31 = lVar31 + 1;
      auVar57._0_4_ = auVar38._0_4_ * auVar38._0_4_;
      auVar57._4_4_ = auVar38._4_4_ * auVar38._4_4_;
      auVar57._8_4_ = auVar38._8_4_ * auVar38._8_4_;
      auVar57._12_4_ = auVar38._12_4_ * auVar38._12_4_;
      auVar36 = vshufpd_avx(auVar38,auVar38,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar21) = auVar38;
      lVar21 = lVar21 + 4;
      pfVar26 = pfVar26 + 0x78;
      pfVar18 = pfVar18 + 0x78;
      auVar35 = vmovshdup_avx(auVar57);
      auVar37 = vfmadd231ss_fma(auVar35,auVar38,auVar38);
      auVar35 = vshufps_avx(auVar38,auVar38,0xff);
      auVar36 = vfmadd213ss_fma(auVar36,auVar36,auVar37);
      auVar35 = vfmadd213ss_fma(auVar35,auVar35,auVar36);
      auVar62 = ZEXT464((uint)(auVar62._0_4_ + auVar35._0_4_));
    }
    pfVar25 = pfVar25 + 5;
    pfVar17 = pfVar17 + 5;
    uVar29 = (ulong)(uVar27 + 5);
  }
  if (auVar62._0_4_ < 0.0) {
    fVar50 = sqrtf(auVar62._0_4_);
  }
  else {
    auVar35 = vsqrtss_avx(auVar62._0_16_,auVar62._0_16_);
    fVar50 = auVar35._0_4_;
  }
  for (lVar21 = 0; lVar21 != 0x40; lVar21 = lVar21 + 1) {
    ipoint->descriptor[lVar21] = (1.0 / fVar50) * ipoint->descriptor[lVar21];
  }
  return;
}

Assistant:

void get_msurf_descriptor_rounding(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptors_pecompute_haar
        - simplify rounding as (int) (x+0.5) if x>=0 and (int) (x-0.5) oterwise where return of roundf is int
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;

    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    { // some outside

        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            // int sample_y = (int) roundf(ipoint_y + l * scale);
            float ipoint_y_sub_int_scale_add_l_mul_scale = ipoint_y_sub_int_scale + l * scale;
            int sample_y_sub_int_scale = (int) (ipoint_y_sub_int_scale_add_l_mul_scale + (ipoint_y_sub_int_scale_add_l_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; ++k, k_count++) {

                //Get x coords of sample point
                // int sample_x = (int) roundf(ipoint_x + k * scale);
                float ipoint_x_sub_int_scale_add_k_mul_scale = ipoint_x_sub_int_scale + k * scale;
                int sample_x_sub_int_scale = (int) (ipoint_x_sub_int_scale_add_k_mul_scale + (ipoint_x_sub_int_scale_add_k_mul_scale>=0 ? 0.5 : -0.5));

                // float rx = 0.0f;
                // float ry = 0.0f;
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);

                // haarResponseX[(l+12)*24+(k+12)] = rx;
                // haarResponseY[(l+12)*24+(k+12)] = ry;
            }

        }

    } else {

        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            // int sample_y = (int) roundf(ipoint_y + l * scale);
            int sample_y_sub_int_scale = (int)(ipoint_y_sub_int_scale_add_05 + l * scale);

            for (int k=-12, k_count=0; k<12; ++k, ++k_count) {

                //Get x coords of sample point
                // int sample_x = (int) roundf(ipoint_x + k * scale);
                int sample_x_sub_int_scale = (int)(ipoint_x_sub_int_scale_add_05 + k * scale);

                // float rx = 0.0f;
                // float ry = 0.0f;
                haarXY_unconditional(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);

                // haarResponseX[(l+12)*24+(k+12)] = rx;
                // haarResponseY[(l+12)*24+(k+12)] = ry;
            }

        }
        
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}